

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseBuilder::embedLabel(BaseBuilder *this,Label *label,size_t dataSize)

{
  uint32_t uVar1;
  Error EVar2;
  ulong uVar3;
  BaseNode *unaff_R15;
  size_t sStack_28;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    return 5;
  }
  if ((dataSize != 0) &&
     ((8 < dataSize ||
      (uVar3 = dataSize - (dataSize >> 1 & 0x5555555555555555),
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333),
      1 < (byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))))) {
    EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,2,(char *)0x0);
    return EVar2;
  }
  if (*(long *)&this->_allocator == 0) {
    embedLabel();
  }
  else {
    uVar1 = (label->super_Operand).super_Operand_._baseId;
    unaff_R15 = (BaseNode *)ZoneAllocator::_alloc(&this->_allocator,0x38,&sStack_28);
    if (unaff_R15 != (BaseNode *)0x0) {
      *(undefined8 *)unaff_R15 = 0;
      *(undefined8 *)(unaff_R15 + 8) = 0;
      unaff_R15[0x10] = (BaseNode)0x6;
      unaff_R15[0x11] = (BaseNode)(this->_nodeFlags | kIsData);
      *(undefined8 *)(unaff_R15 + 0x12) = 0;
      *(undefined8 *)(unaff_R15 + 0x1a) = 0;
      *(undefined8 *)(unaff_R15 + 0x20) = 0;
      *(undefined8 *)(unaff_R15 + 0x28) = 0;
      *(uint32_t *)(unaff_R15 + 0x30) = uVar1;
      *(int *)(unaff_R15 + 0x34) = (int)dataSize;
      goto LAB_00117673;
    }
  }
  EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  if (EVar2 != 0) {
    return EVar2;
  }
LAB_00117673:
  addNode(this,unaff_R15);
  return 0;
}

Assistant:

Error BaseBuilder::embedLabel(const Label& label, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!BaseBuilder_checkDataSize(dataSize))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  EmbedLabelNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedLabelNode>(&node, label.id(), uint32_t(dataSize)));

  addNode(node);
  return kErrorOk;
}